

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,ValuePair *pair)

{
  ValueLength *pVVar1;
  ValueType VVar2;
  ValueLength VVar3;
  Exception *this_00;
  ValueLength VVar4;
  ulong len;
  
  VVar4 = this->_pos;
  checkKeyHasValidType(this,(pair->_type & ~Null) == UInt);
  VVar2 = pair->_type;
  if (VVar2 == Custom) {
    if (this->options->disallowCustom == true) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,BuilderCustomDisallowed);
LAB_00105e6b:
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    len = pair->_size;
    reserve(this,len);
    if (pair->_start != (uint8_t *)0x0) {
      memcpy(this->_start + this->_pos,pair->_start,len);
    }
    VVar4 = this->_pos;
    VVar3 = VVar4 + len;
  }
  else {
    if (VVar2 == Binary) {
      len = pair->_size;
      reserve(this,len + 9);
      appendUInt(this,len,0xbf);
LAB_00105df7:
      if (len == 0) goto LAB_00105e23;
    }
    else {
      if (VVar2 != String) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  (this_00,BuilderUnexpectedType,
                   "Only ValueType::Binary, ValueType::String and ValueType::Custom are valid for ValuePair argument"
                  );
        goto LAB_00105e6b;
      }
      len = pair->_size;
      if (len < 0x7f) {
        reserve(this,len + 1);
        appendByteUnchecked(this,(char)len + '@');
        goto LAB_00105df7;
      }
      reserve(this,len + 9);
      appendByteUnchecked(this,0xbf);
      appendLengthUnchecked<8ul>(this,len);
    }
    memcpy(this->_start + this->_pos,pair->_start,len);
    VVar3 = this->_pos + len;
  }
  this->_pos = VVar3;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + len;
LAB_00105e23:
  return this->_start + VVar4;
}

Assistant:

uint8_t* Builder::set(ValuePair const& pair) {
  // This method builds a single further VPack item at the current
  // append position. This is the case for ValueType::String,
  // ValueType::Binary, or ValueType::Custom, which can be built
  // with two pieces of information

  auto const oldPos = _pos;

  checkKeyHasValidType(pair.valueType() == ValueType::String ||
                       pair.valueType() == ValueType::UInt);

  if (pair.valueType() == ValueType::String) {
    uint64_t size = pair.getSize();
    if (size > 126) {
      // long string
      reserve(1 + 8 + size);
      appendByteUnchecked(0xbf);
      appendLengthUnchecked<8>(size);
    } else {
      // short string
      reserve(1 + size);
      appendByteUnchecked(static_cast<uint8_t>(0x40 + size));
    }
    if (size != 0) {
      VELOCYPACK_ASSERT(pair.getStart() != nullptr);
      std::memcpy(_start + _pos, pair.getStart(), checkOverflow(size));
      advance(size);
    }
    return _start + oldPos;
  } else if (pair.valueType() == ValueType::Binary) {
    uint64_t v = pair.getSize();
    reserve(9 + v);
    appendUInt(v, 0xbf);
    if (v != 0) {
      VELOCYPACK_ASSERT(pair.getStart() != nullptr);
      std::memcpy(_start + _pos, pair.getStart(), checkOverflow(v));
      advance(v);
    }
    return _start + oldPos;
  } else if (pair.valueType() == ValueType::Custom) {
    if (options->disallowCustom) {
      // Custom values explicitly disallowed as a security precaution
      throw Exception(Exception::BuilderCustomDisallowed);
    }
    // We only reserve space here, the caller has to fill in the custom type
    uint64_t size = pair.getSize();
    reserve(size);
    uint8_t const* p = pair.getStart();
    if (p != nullptr) {
      std::memcpy(_start + _pos, p, checkOverflow(size));
    }
    advance(size);
    return _start + _pos - size;
  }
  throw Exception(Exception::BuilderUnexpectedType,
                  "Only ValueType::Binary, ValueType::String and "
                  "ValueType::Custom are valid for ValuePair argument");
}